

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::ImageButtonEx
               (ImGuiID id,ImTextureID texture_id,ImVec2 *size,ImVec2 *uv0,ImVec2 *uv1,
               ImVec2 *padding,ImVec4 *bg_col,ImVec4 *tint_col)

{
  ImVec2 IVar1;
  ImGuiWindow *pIVar2;
  ImDrawList *pIVar3;
  float fVar4;
  undefined8 uVar5;
  float fVar6;
  ImGuiContext *pIVar7;
  ImRect IVar8;
  undefined1 uVar9;
  bool bVar10;
  ImU32 IVar11;
  undefined7 extraout_var;
  ImGuiCol idx;
  ImGuiContext *g;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  ImRect bb;
  bool local_72;
  bool local_71;
  ImRect local_70;
  undefined8 local_60;
  ImVec2 *local_58;
  ImTextureID local_50;
  ImVec2 *local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar7 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  if (pIVar2->SkipItems == false) {
    IVar1 = (pIVar2->DC).CursorPos;
    auVar12._8_8_ = 0;
    auVar12._0_4_ = IVar1.x;
    auVar12._4_4_ = IVar1.y;
    fVar4 = (*padding).x;
    fVar6 = (*padding).y;
    auVar15._0_4_ = IVar1.x + (*size).x + fVar4 + fVar4;
    auVar15._4_4_ = IVar1.y + (*size).y + fVar6 + fVar6;
    auVar15._8_8_ = 0;
    local_70 = (ImRect)vmovlhps_avx(auVar12,auVar15);
    local_50 = texture_id;
    local_48 = uv0;
    ItemSize(&local_70,-1.0);
    local_60 = 0;
    bVar10 = ItemAdd(&local_70,id,(ImRect *)0x0,0);
    if (bVar10) {
      local_58 = uv1;
      bVar10 = ButtonBehavior(&local_70,id,&local_72,&local_71,0);
      local_60 = CONCAT71(extraout_var,bVar10);
      if ((local_71 != true) || (idx = 0x17, local_72 == false)) {
        idx = local_72 + 0x15;
      }
      IVar11 = GetColorU32(idx,1.0);
      RenderNavHighlight(&local_70,id,1);
      auVar12 = vminss_avx(ZEXT416((uint)padding->x),ZEXT416((uint)padding->y));
      auVar15 = vminss_avx(ZEXT416((uint)(pIVar7->Style).FrameRounding),auVar12);
      uVar5 = vcmpss_avx512f(auVar12,ZEXT816(0) << 0x40,1);
      RenderFrame(local_70.Min,local_70.Max,IVar11,true,
                  (float)((uint)!(bool)((byte)uVar5 & 1) * auVar15._0_4_));
      IVar8 = local_70;
      if (0.0 < bg_col->w) {
        pIVar3 = pIVar2->DrawList;
        IVar1 = *padding;
        auVar13._8_8_ = 0;
        auVar13._0_4_ = IVar1.x;
        auVar13._4_4_ = IVar1.y;
        auVar18._8_8_ = 0;
        auVar18._0_4_ = local_70.Max.x;
        auVar18._4_4_ = local_70.Max.y;
        auVar16._0_4_ = IVar8.Min.x + IVar1.x;
        auVar16._4_4_ = IVar8.Min.y + IVar1.y;
        auVar16._8_8_ = 0;
        local_38 = (ImVec2)vmovlps_avx(auVar16);
        auVar12 = vsubps_avx(auVar18,auVar13);
        local_40 = (ImVec2)vmovlps_avx(auVar12);
        local_70 = IVar8;
        IVar11 = GetColorU32(bg_col);
        ImDrawList::AddRectFilled(pIVar3,&local_38,&local_40,IVar11,0.0,0);
      }
      IVar8 = local_70;
      pIVar3 = pIVar2->DrawList;
      IVar1 = *padding;
      auVar14._8_8_ = 0;
      auVar14._0_4_ = IVar1.x;
      auVar14._4_4_ = IVar1.y;
      auVar19._8_8_ = 0;
      auVar19._0_4_ = local_70.Max.x;
      auVar19._4_4_ = local_70.Max.y;
      auVar17._0_4_ = IVar8.Min.x + IVar1.x;
      auVar17._4_4_ = IVar8.Min.y + IVar1.y;
      auVar17._8_8_ = 0;
      local_38 = (ImVec2)vmovlps_avx(auVar17);
      auVar12 = vsubps_avx(auVar19,auVar14);
      local_40 = (ImVec2)vmovlps_avx(auVar12);
      local_70 = IVar8;
      IVar11 = GetColorU32(tint_col);
      ImDrawList::AddImage(pIVar3,local_50,&local_38,&local_40,local_48,local_58,IVar11);
    }
    uVar9 = (undefined1)local_60;
  }
  else {
    uVar9 = 0;
  }
  return (bool)uVar9;
}

Assistant:

bool ImGui::ImageButtonEx(ImGuiID id, ImTextureID texture_id, const ImVec2& size, const ImVec2& uv0, const ImVec2& uv1, const ImVec2& padding, const ImVec4& bg_col, const ImVec4& tint_col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + size + padding * 2);
    ItemSize(bb);
    if (!ItemAdd(bb, id))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held);

    // Render
    const ImU32 col = GetColorU32((held && hovered) ? ImGuiCol_ButtonActive : hovered ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
    RenderNavHighlight(bb, id);
    RenderFrame(bb.Min, bb.Max, col, true, ImClamp((float)ImMin(padding.x, padding.y), 0.0f, g.Style.FrameRounding));
    if (bg_col.w > 0.0f)
        window->DrawList->AddRectFilled(bb.Min + padding, bb.Max - padding, GetColorU32(bg_col));
    window->DrawList->AddImage(texture_id, bb.Min + padding, bb.Max - padding, uv0, uv1, GetColorU32(tint_col));

    return pressed;
}